

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O1

Property *
Rml::ElementStyle::GetLocalProperty
          (PropertyId id,PropertyDictionary *inline_properties,ElementDefinition *definition)

{
  Property *pPVar1;
  
  pPVar1 = PropertyDictionary::GetProperty(inline_properties,id);
  if (pPVar1 == (Property *)0x0) {
    if (definition != (ElementDefinition *)0x0) {
      pPVar1 = ElementDefinition::GetProperty(definition,id);
      return pPVar1;
    }
    pPVar1 = (Property *)0x0;
  }
  return pPVar1;
}

Assistant:

const Property* ElementStyle::GetLocalProperty(PropertyId id, const PropertyDictionary& inline_properties, const ElementDefinition* definition)
{
	// Check for overriding local properties.
	const Property* property = inline_properties.GetProperty(id);
	if (property)
		return property;

	// Check for a property defined in an RCSS rule.
	if (definition)
		return definition->GetProperty(id);

	return nullptr;
}